

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

size_t upb_Message_ExtensionCount(upb_Message *msg)

{
  upb_Map *puVar1;
  upb_Extension *puVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  uint *puVar7;
  ulong uVar6;
  
  uVar6 = (msg->field_0).internal_opaque;
  if (uVar6 < 2) {
    sVar4 = 0;
  }
  else {
    uVar5 = 0;
    sVar4 = 0;
    while (puVar7 = (uint *)(uVar6 & 0xfffffffffffffffe), uVar6 = uVar5, puVar7 != (uint *)0x0) {
LAB_0024ef2e:
      do {
        do {
          uVar5 = uVar6 + 1;
          if (*puVar7 <= uVar6) {
            return sVar4;
          }
          uVar6 = uVar5;
        } while ((*(uintptr_t *)(puVar7 + uVar5 * 2) & 1) == 0);
        puVar2 = upb_TaggedAuxPtr_Extension((upb_TaggedAuxPtr)*(uintptr_t *)(puVar7 + uVar5 * 2));
        switch((puVar2->ext->field_dont_copy_me__upb_internal_use_only).
               mode_dont_copy_me__upb_internal_use_only & 3) {
        case 0:
          puVar1 = (puVar2->data).map_val;
          if (puVar1->is_strtable_dont_copy_me__upb_internal_use_only == true) {
            uVar3 = (ulong)*(uint *)((long)&puVar1->t + 8);
          }
          else {
            uVar3 = upb_inttable_count(&(puVar1->t).inttable);
          }
          if (uVar3 != 0) goto switchD_0024ef5f_caseD_2;
          goto LAB_0024ef2e;
        case 2:
          goto switchD_0024ef5f_caseD_2;
        case 3:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/extension.h"
                        ,0x3f,
                        "_Bool _upb_Extension_IsEmpty_dont_copy_me__upb_internal_use_only(const upb_Extension *)"
                       );
        }
      } while (((puVar2->data).array_val)->size_dont_copy_me__upb_internal_use_only == 0);
switchD_0024ef5f_caseD_2:
      sVar4 = sVar4 + 1;
      uVar6 = (msg->field_0).internal_opaque;
    }
  }
  return sVar4;
}

Assistant:

size_t upb_Message_ExtensionCount(const upb_Message* msg) {
  upb_Message_Internal* in = UPB_PRIVATE(_upb_Message_GetInternal)(msg);
  if (!in) return 0;
  const upb_MiniTableExtension* ext;
  upb_MessageValue val;
  uintptr_t iter = kUpb_Message_ExtensionBegin;
  size_t count = 0;
  while (upb_Message_NextExtension(msg, &ext, &val, &iter)) {
    count++;
  }
  return count;
}